

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

void Vec_PtrRemove(Vec_Ptr_t *p,void *Entry)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = p->nSize;
  lVar4 = (ulong)uVar1 + 1;
  do {
    if ((int)lVar4 + -1 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    lVar3 = lVar4 + -1;
    lVar2 = lVar4 + -2;
    lVar4 = lVar3;
  } while (p->pArray[lVar2] != Entry);
  for (; (int)lVar3 < (int)uVar1; lVar3 = lVar3 + 1) {
    p->pArray[lVar3 + -1] = p->pArray[lVar3];
  }
  p->nSize = uVar1 - 1;
  return;
}

Assistant:

static inline void Vec_PtrRemove( Vec_Ptr_t * p, void * Entry )
{
    int i;
    // delete assuming that it is closer to the end
    for ( i = p->nSize - 1; i >= 0; i-- )
        if ( p->pArray[i] == Entry )
            break;
    assert( i >= 0 );
/*
    // delete assuming that it is closer to the beginning
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
*/
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}